

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-and-bound-solver.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::make_init_node_0
          (branch_and_bound_solver<baryonyx::itm::minimize_tag,_float> *this)

{
  pointer pnVar1;
  size_type sVar2;
  size_t __len;
  ulong __n;
  uint local_14 [2];
  float local_c;
  
  local_c = 0.0;
  local_14[1] = 0;
  local_14[0] = 0;
  std::
  vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node>>
  ::emplace_back<float,int,unsigned_int>
            ((vector<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node,std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,float>::node>>
              *)&this->nodes,&local_c,(int *)(local_14 + 1),local_14);
  sVar2 = shared_subvector::emplace(&this->subvector);
  pnVar1 = (this->nodes).
           super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pnVar1[-1].variables = sVar2;
  pnVar1[-1].z = (this->items).
                 super__Vector_base<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item,_std::allocator<baryonyx::itm::branch_and_bound_solver<baryonyx::itm::minimize_tag,_float>::item>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].sum_z;
  __n = (ulong)(this->subvector).m_element_size;
  if (__n != 0) {
    memset((this->subvector).m_container.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start + sVar2,0,__n);
  }
  return;
}

Assistant:

void make_init_node_0()
    {
        nodes.emplace_back(Float{ 0 }, 0, 0u);
        nodes.back().variables = subvector.emplace();
        nodes.back().z = items[1].sum_z;

        subvector.fill(nodes.back().variables, 0);
    }